

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::ConsoleReporter::AssertionPrinter::printReconstructedExpression(AssertionPrinter *this)

{
  bool bVar1;
  ostream *poVar2;
  Colour colourGuard;
  string local_a8;
  Text local_88;
  TextAttributes local_30;
  
  bVar1 = AssertionResult::hasExpandedExpression(this->result);
  if (bVar1) {
    std::operator<<(this->stream,"with expansion:\n");
    colourGuard.m_moved = false;
    Colour::use(ReconstructedExpression);
    poVar2 = this->stream;
    std::__cxx11::string::string((string *)&local_a8,(string *)&this->result->m_resultData);
    local_30.initialIndent = 0xffffffffffffffff;
    local_30.width = 0x4f;
    local_30.tabChar = '\t';
    local_30.indent = 2;
    Tbc::Text::Text(&local_88,&local_a8,&local_30);
    poVar2 = Tbc::operator<<(poVar2,&local_88);
    std::operator<<(poVar2,"\n");
    Tbc::Text::~Text(&local_88);
    std::__cxx11::string::~string((string *)&local_a8);
    Colour::~Colour(&colourGuard);
  }
  return;
}

Assistant:

void printReconstructedExpression() const {
                if( result.hasExpandedExpression() ) {
                    stream << "with expansion:\n";
                    Colour colourGuard( Colour::ReconstructedExpression );
                    stream << Text( result.getExpandedExpression(), TextAttributes().setIndent(2) ) << "\n";
                }
            }